

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_intent_string(int ii)

{
  char *pcStack_10;
  int ii_local;
  
  if (ii == 2) {
    pcStack_10 = "Correlation statistic";
  }
  else if (ii == 3) {
    pcStack_10 = "T-statistic";
  }
  else if (ii == 4) {
    pcStack_10 = "F-statistic";
  }
  else if (ii == 5) {
    pcStack_10 = "Z-score";
  }
  else if (ii == 6) {
    pcStack_10 = "Chi-squared distribution";
  }
  else if (ii == 7) {
    pcStack_10 = "Beta distribution";
  }
  else if (ii == 8) {
    pcStack_10 = "Binomial distribution";
  }
  else if (ii == 9) {
    pcStack_10 = "Gamma distribution";
  }
  else if (ii == 10) {
    pcStack_10 = "Poisson distribution";
  }
  else if (ii == 0xb) {
    pcStack_10 = "Normal distribution";
  }
  else if (ii == 0xc) {
    pcStack_10 = "F-statistic noncentral";
  }
  else if (ii == 0xd) {
    pcStack_10 = "Chi-squared noncentral";
  }
  else if (ii == 0xe) {
    pcStack_10 = "Logistic distribution";
  }
  else if (ii == 0xf) {
    pcStack_10 = "Laplace distribution";
  }
  else if (ii == 0x10) {
    pcStack_10 = "Uniform distribition";
  }
  else if (ii == 0x11) {
    pcStack_10 = "T-statistic noncentral";
  }
  else if (ii == 0x12) {
    pcStack_10 = "Weibull distribution";
  }
  else if (ii == 0x13) {
    pcStack_10 = "Chi distribution";
  }
  else if (ii == 0x14) {
    pcStack_10 = "Inverse Gaussian distribution";
  }
  else if (ii == 0x15) {
    pcStack_10 = "Extreme Value distribution";
  }
  else if (ii == 0x16) {
    pcStack_10 = "P-value";
  }
  else if (ii == 0x17) {
    pcStack_10 = "Log P-value";
  }
  else if (ii == 0x18) {
    pcStack_10 = "Log10 P-value";
  }
  else if (ii == 0x3e9) {
    pcStack_10 = "Estimate";
  }
  else if (ii == 0x3ea) {
    pcStack_10 = "Label index";
  }
  else if (ii == 0x3eb) {
    pcStack_10 = "NeuroNames index";
  }
  else if (ii == 0x3ec) {
    pcStack_10 = "General matrix";
  }
  else if (ii == 0x3ed) {
    pcStack_10 = "Symmetric matrix";
  }
  else if (ii == 0x3ee) {
    pcStack_10 = "Displacement vector";
  }
  else if (ii == 0x3ef) {
    pcStack_10 = "Vector";
  }
  else if (ii == 0x3f0) {
    pcStack_10 = "Pointset";
  }
  else if (ii == 0x3f1) {
    pcStack_10 = "Triangle";
  }
  else if (ii == 0x3f2) {
    pcStack_10 = "Quaternion";
  }
  else if (ii == 0x3f3) {
    pcStack_10 = "Dimensionless number";
  }
  else {
    pcStack_10 = "Unknown";
  }
  return pcStack_10;
}

Assistant:

char const *nifti_intent_string( int ii )
{
   switch( ii ){
     case NIFTI_INTENT_CORREL:     return "Correlation statistic" ;
     case NIFTI_INTENT_TTEST:      return "T-statistic" ;
     case NIFTI_INTENT_FTEST:      return "F-statistic" ;
     case NIFTI_INTENT_ZSCORE:     return "Z-score"     ;
     case NIFTI_INTENT_CHISQ:      return "Chi-squared distribution" ;
     case NIFTI_INTENT_BETA:       return "Beta distribution" ;
     case NIFTI_INTENT_BINOM:      return "Binomial distribution" ;
     case NIFTI_INTENT_GAMMA:      return "Gamma distribution" ;
     case NIFTI_INTENT_POISSON:    return "Poisson distribution" ;
     case NIFTI_INTENT_NORMAL:     return "Normal distribution" ;
     case NIFTI_INTENT_FTEST_NONC: return "F-statistic noncentral" ;
     case NIFTI_INTENT_CHISQ_NONC: return "Chi-squared noncentral" ;
     case NIFTI_INTENT_LOGISTIC:   return "Logistic distribution" ;
     case NIFTI_INTENT_LAPLACE:    return "Laplace distribution" ;
     case NIFTI_INTENT_UNIFORM:    return "Uniform distribition" ;
     case NIFTI_INTENT_TTEST_NONC: return "T-statistic noncentral" ;
     case NIFTI_INTENT_WEIBULL:    return "Weibull distribution" ;
     case NIFTI_INTENT_CHI:        return "Chi distribution" ;
     case NIFTI_INTENT_INVGAUSS:   return "Inverse Gaussian distribution" ;
     case NIFTI_INTENT_EXTVAL:     return "Extreme Value distribution" ;
     case NIFTI_INTENT_PVAL:       return "P-value" ;

     case NIFTI_INTENT_LOGPVAL:    return "Log P-value" ;
     case NIFTI_INTENT_LOG10PVAL:  return "Log10 P-value" ;

     case NIFTI_INTENT_ESTIMATE:   return "Estimate" ;
     case NIFTI_INTENT_LABEL:      return "Label index" ;
     case NIFTI_INTENT_NEURONAME:  return "NeuroNames index" ;
     case NIFTI_INTENT_GENMATRIX:  return "General matrix" ;
     case NIFTI_INTENT_SYMMATRIX:  return "Symmetric matrix" ;
     case NIFTI_INTENT_DISPVECT:   return "Displacement vector" ;
     case NIFTI_INTENT_VECTOR:     return "Vector" ;
     case NIFTI_INTENT_POINTSET:   return "Pointset" ;
     case NIFTI_INTENT_TRIANGLE:   return "Triangle" ;
     case NIFTI_INTENT_QUATERNION: return "Quaternion" ;

     case NIFTI_INTENT_DIMLESS:    return "Dimensionless number" ;
   }
   return "Unknown" ;
}